

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O2

string * __thiscall
FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,4);
  std::operator+(&local_98,"OPTPFor<",&local_38);
  std::operator+(&local_78,&local_98,",");
  Simple16<false>::name_abi_cxx11_(&sStack_b8,(Simple16<false> *)((long)this + 8));
  std::operator+(&local_58,&local_78,&sStack_b8);
  std::operator+(__return_storage_ptr__,&local_58,">");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const {
    return "OPTPFor<" + std::to_string(BlockSizeInUnitsOfPackSize) + ","
           + NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder.name()
           + ">";
  }